

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerGLSL::layout_for_member_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *type,uint32_t index)

{
  ID *__k;
  uint uVar1;
  Decoration *pDVar2;
  bool bVar3;
  mapped_type *pmVar4;
  runtime_error *this_00;
  uint uVar5;
  ulong uVar6;
  uint *ts_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *elem;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  Bitset flags;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  attr;
  string local_12a0;
  Bitset local_1280;
  undefined1 local_1240 [280];
  undefined1 local_1128 [4120];
  Buffer *local_110;
  size_t local_108;
  size_t local_100;
  Buffer local_f8 [8];
  
  uVar5 = 0x81;
  if ((this->options).es != false) {
    uVar5 = 299;
  }
  if ((this->options).version <= uVar5) {
LAB_0025017b:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    return __return_storage_ptr__;
  }
  __k = &(type->super_IVariant).self;
  bVar3 = Compiler::has_decoration
                    (&this->super_Compiler,(ID)(type->super_IVariant).self.id,DecorationBlock);
  if ((!bVar3) &&
     (bVar3 = Compiler::has_decoration(&this->super_Compiler,(ID)__k->id,DecorationBufferBlock),
     !bVar3)) goto LAB_0025017b;
  pmVar4 = ::std::__detail::
           _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&(this->super_Compiler).ir.meta,__k);
  uVar6 = (ulong)index;
  if ((pmVar4->members).super_VectorView<spirv_cross::Meta::Decoration>.buffer_size <= uVar6)
  goto LAB_0025017b;
  pDVar2 = (pmVar4->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr;
  local_1240._0_8_ = local_1240 + 0x18;
  local_1240._8_8_ = 0;
  local_1240._16_8_ = 8;
  bVar3 = Compiler::has_member_decoration
                    (&this->super_Compiler,(TypeID)__k->id,index,DecorationPassthroughNV);
  if (bVar3) {
    local_1128._0_8_ = local_1128 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1128,"passthrough","");
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)local_1240,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
    if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
      operator_delete((void *)local_1128._0_8_);
    }
  }
  ts_1 = (uint *)(ulong)index;
  Compiler::combined_decoration_for_member(&local_1280,&this->super_Compiler,type,index);
  if (((byte)local_1280.lower & 0x10) != 0) {
    local_1128._0_8_ = local_1128 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1128,"row_major","");
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)local_1240,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
    if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
      operator_delete((void *)local_1128._0_8_);
    }
  }
  if (((pDVar2[uVar6].decoration_flags.lower & 0x40000000) != 0) &&
     (bVar3 = can_use_io_location(this,type->storage,true), bVar3)) {
    join<char_const(&)[12],unsigned_int&>
              ((string *)local_1128,(spirv_cross *)"location = ",
               (char (*) [12])&pDVar2[uVar6].location,ts_1);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)local_1240,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
    if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
      operator_delete((void *)local_1128._0_8_);
    }
  }
  if (((pDVar2[uVar6].decoration_flags.lower & 0x80000000) != 0) &&
     (bVar3 = can_use_io_location(this,type->storage,true), bVar3)) {
    if ((this->options).es != false) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error
                (this_00,"Component decoration is not supported in ES targets.");
LAB_0025041f:
      *(undefined ***)this_00 = &PTR__runtime_error_003a2f80;
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    uVar1 = (this->options).version;
    uVar5 = uVar1 - 0x8c;
    ts_1 = (uint *)(ulong)uVar5;
    if (uVar5 < 300) {
      local_1128._0_8_ = local_1128 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1128,"GL_ARB_enhanced_layouts","");
      require_extension_internal(this,(string *)local_1128);
      if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
        operator_delete((void *)local_1128._0_8_);
      }
    }
    else if (uVar1 < 0x8c) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error
                (this_00,"Component decoration is not supported in targets below GLSL 1.40.");
      goto LAB_0025041f;
    }
    join<char_const(&)[13],unsigned_int&>
              ((string *)local_1128,(spirv_cross *)"component = ",
               (char (*) [13])&pDVar2[uVar6].component,ts_1);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)local_1240,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
    if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
      operator_delete((void *)local_1128._0_8_);
    }
  }
  bVar3 = Compiler::has_extended_decoration
                    (&this->super_Compiler,__k->id,SPIRVCrossDecorationExplicitOffset);
  if ((bVar3) && ((pDVar2[uVar6].decoration_flags.lower & 0x800000000) != 0)) {
    join<char_const(&)[10],unsigned_int&>
              ((string *)local_1128,(spirv_cross *)0x30906b,(char (*) [10])&pDVar2[uVar6].offset,
               ts_1);
  }
  else {
    if ((type->storage != StorageClassOutput) ||
       ((pDVar2[uVar6].decoration_flags.lower & 0x800000000) == 0)) goto LAB_0025029c;
    join<char_const(&)[14],unsigned_int&>
              ((string *)local_1128,(spirv_cross *)0x309067,(char (*) [14])&pDVar2[uVar6].offset,
               ts_1);
  }
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
               *)local_1240,
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
  if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
    operator_delete((void *)local_1128._0_8_);
  }
LAB_0025029c:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_1240._8_8_ == 0) {
    ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"layout(","")
    ;
    local_110 = local_f8;
    local_1128._16_8_ = 0;
    local_1128._0_8_ = (pointer)0x0;
    local_1128._8_8_ = 0;
    local_108 = 0;
    local_100 = 8;
    StringStream<4096UL,_4096UL>::reset((StringStream<4096UL,_4096UL> *)local_1128);
    if (local_1240._8_8_ != 0) {
      pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_1240._0_8_ + local_1240._8_8_ * 0x20);
      pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1240._0_8_
      ;
      do {
        StringStream<4096UL,_4096UL>::append
                  ((StringStream<4096UL,_4096UL> *)local_1128,(pbVar7->_M_dataplus)._M_p,
                   pbVar7->_M_string_length);
        if (pbVar7 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_1240._0_8_ + (local_1240._8_8_ - 1) * 0x20)) {
          StringStream<4096UL,_4096UL>::append((StringStream<4096UL,_4096UL> *)local_1128,", ",2);
        }
        pbVar7 = pbVar7 + 1;
      } while (pbVar7 != pbVar8);
    }
    StringStream<4096ul,4096ul>::str_abi_cxx11_(&local_12a0,local_1128);
    StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)local_1128);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_12a0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_12a0._M_dataplus._M_p != &local_12a0.field_2) {
      operator_delete(local_12a0._M_dataplus._M_p);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_1280.higher._M_h);
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                  *)local_1240);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::layout_for_member(const SPIRType &type, uint32_t index)
{
	if (is_legacy())
		return "";

	bool is_block = has_decoration(type.self, DecorationBlock) || has_decoration(type.self, DecorationBufferBlock);
	if (!is_block)
		return "";

	auto &memb = ir.meta[type.self].members;
	if (index >= memb.size())
		return "";
	auto &dec = memb[index];

	SmallVector<string> attr;

	if (has_member_decoration(type.self, index, DecorationPassthroughNV))
		attr.push_back("passthrough");

	// We can only apply layouts on members in block interfaces.
	// This is a bit problematic because in SPIR-V decorations are applied on the struct types directly.
	// This is not supported on GLSL, so we have to make the assumption that if a struct within our buffer block struct
	// has a decoration, it was originally caused by a top-level layout() qualifier in GLSL.
	//
	// We would like to go from (SPIR-V style):
	//
	// struct Foo { layout(row_major) mat4 matrix; };
	// buffer UBO { Foo foo; };
	//
	// to
	//
	// struct Foo { mat4 matrix; }; // GLSL doesn't support any layout shenanigans in raw struct declarations.
	// buffer UBO { layout(row_major) Foo foo; }; // Apply the layout on top-level.
	auto flags = combined_decoration_for_member(type, index);

	if (flags.get(DecorationRowMajor))
		attr.push_back("row_major");
	// We don't emit any global layouts, so column_major is default.
	//if (flags & (1ull << DecorationColMajor))
	//    attr.push_back("column_major");

	if (dec.decoration_flags.get(DecorationLocation) && can_use_io_location(type.storage, true))
		attr.push_back(join("location = ", dec.location));

	// Can only declare component if we can declare location.
	if (dec.decoration_flags.get(DecorationComponent) && can_use_io_location(type.storage, true))
	{
		if (!options.es)
		{
			if (options.version < 440 && options.version >= 140)
				require_extension_internal("GL_ARB_enhanced_layouts");
			else if (options.version < 140)
				SPIRV_CROSS_THROW("Component decoration is not supported in targets below GLSL 1.40.");
			attr.push_back(join("component = ", dec.component));
		}
		else
			SPIRV_CROSS_THROW("Component decoration is not supported in ES targets.");
	}

	// SPIRVCrossDecorationPacked is set by layout_for_variable earlier to mark that we need to emit offset qualifiers.
	// This is only done selectively in GLSL as needed.
	if (has_extended_decoration(type.self, SPIRVCrossDecorationExplicitOffset) &&
	    dec.decoration_flags.get(DecorationOffset))
		attr.push_back(join("offset = ", dec.offset));
	else if (type.storage == StorageClassOutput && dec.decoration_flags.get(DecorationOffset))
		attr.push_back(join("xfb_offset = ", dec.offset));

	if (attr.empty())
		return "";

	string res = "layout(";
	res += merge(attr);
	res += ") ";
	return res;
}